

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O3

string * __thiscall so_5::agent_t::so_coop_name_abi_cxx11_(agent_t *this)

{
  string *psVar1;
  exception_t *this_00;
  string local_40;
  
  if (this->m_agent_coop != (coop_t *)0x0) {
    psVar1 = coop_t::query_coop_name_abi_cxx11_(this->m_agent_coop);
    return psVar1;
  }
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"agent isn\'t bound to cooperation yet","");
  exception_t::exception_t(this_00,&local_40,0xe);
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

const std::string &
agent_t::so_coop_name() const
{
	if( 0 == m_agent_coop )
		throw exception_t(
			"agent isn't bound to cooperation yet",
			rc_agent_has_no_cooperation );

	return m_agent_coop->query_coop_name();
}